

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

void __thiscall
gl4cts::EnhancedLayouts::SSBMemberOffsetAndAlignTest::getProgramInterface
          (SSBMemberOffsetAndAlignTest *this,GLuint test_case_index,
          ProgramInterface *program_interface,VaryingPassthrough *varying_passthrough)

{
  uint uVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  pointer __dest;
  uchar *data;
  ulong uVar2;
  GLuint GVar3;
  GLuint GVar4;
  GLuint GVar5;
  Interface *this_01;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  string *this_02;
  size_t data_size;
  uint expected_stride_of_element;
  Type TVar11;
  Type local_140;
  ulong local_130;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  SSBMemberOffsetAndAlignTest *local_110;
  ulong local_108;
  size_t position;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b0;
  string globals;
  GLchar buffer [16];
  
  globals._M_dataplus._M_p = (pointer)&globals.field_2;
  this_02 = &globals;
  local_110 = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)this_02,
             "const int basic_size = BASIC_SIZE;\nconst int type_align = TYPE_ALIGN;\nconst int type_size  = TYPE_SIZE;\n"
             ,"");
  TVar11 = TestBase::getType((TestBase *)this_02,test_case_index);
  local_140 = TVar11;
  GVar3 = Utils::Type::GetTypeSize(TVar11.m_basic_type);
  GVar4 = Utils::Type::GetBaseAlignment(&local_140,false);
  GVar5 = Utils::Type::GetBaseAlignment(&local_140,true);
  expected_stride_of_element = TVar11.m_n_columns * GVar4;
  uVar6 = expected_stride_of_element - 1 >> 1 | expected_stride_of_element - 1;
  uVar6 = uVar6 >> 2 | uVar6;
  uVar6 = uVar6 >> 4 | uVar6;
  uVar6 = uVar6 >> 8 | uVar6;
  uVar6 = uVar6 >> 0x10 | uVar6;
  uVar1 = uVar6 + 1;
  uVar7 = expected_stride_of_element % (GVar3 >> 1);
  iVar10 = (GVar3 >> 1) - uVar7;
  if (uVar7 == 0) {
    iVar10 = 0;
  }
  local_108 = (ulong)(iVar10 + expected_stride_of_element);
  uVar7 = iVar10 + expected_stride_of_element + expected_stride_of_element;
  uVar6 = uVar6 * 2 + 2;
  uVar2 = (ulong)uVar7 % (ulong)uVar6;
  iVar10 = (int)uVar2;
  local_130 = (ulong)(uVar6 - iVar10);
  if (iVar10 == 0) {
    local_130 = uVar2;
  }
  uVar6 = uVar1 * 3 + expected_stride_of_element;
  uVar8 = uVar6 % GVar4;
  iVar10 = GVar4 - uVar8;
  if (uVar8 == 0) {
    iVar10 = 0;
  }
  uVar6 = iVar10 + uVar6;
  local_118 = (ulong)uVar6;
  uVar6 = uVar6 + expected_stride_of_element;
  uVar8 = uVar6 % GVar4;
  iVar10 = GVar4 - uVar8;
  if (uVar8 == 0) {
    iVar10 = 0;
  }
  uVar6 = iVar10 + uVar6;
  local_120 = (ulong)uVar6;
  uVar6 = expected_stride_of_element + uVar6;
  uVar8 = uVar6 % GVar5;
  iVar10 = GVar5 - uVar8;
  if (uVar8 == 0) {
    iVar10 = 0;
  }
  uVar6 = iVar10 + uVar6;
  local_128 = (ulong)uVar6;
  uVar6 = uVar6 + expected_stride_of_element;
  uVar8 = uVar6 % GVar5;
  iVar10 = GVar5 - uVar8;
  if (uVar8 == 0) {
    iVar10 = 0;
  }
  uVar6 = iVar10 + uVar6;
  uVar8 = expected_stride_of_element + uVar6;
  uVar9 = uVar8 % (GVar3 * 8);
  iVar10 = GVar3 * 8 - uVar9;
  if (uVar9 == 0) {
    iVar10 = 0;
  }
  Utils::Type::GenerateData(&local_b0,&local_140);
  Utils::Type::GenerateData(&local_c8,&local_140);
  Utils::Type::GenerateData(&local_e0,&local_140);
  Utils::Type::GenerateData(&local_f8,&local_140);
  uVar8 = uVar8 + iVar10;
  this_00 = &local_110->m_data;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (this_00,(ulong)(expected_stride_of_element + uVar8));
  uVar7 = (int)local_130 + uVar7;
  __dest = (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  memcpy(__dest,local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start,
         (long)local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
  memcpy(__dest + (local_108 & 0xffffffff),
         local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start,
         (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
  local_130 = (ulong)uVar7;
  memcpy(__dest + uVar7,
         local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start,
         (long)local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
  memcpy(__dest + (local_118 & 0xffffffff),
         local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start,
         (long)local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
  memcpy(__dest + (local_120 & 0xffffffff),
         local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start,
         (long)local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
  memcpy(__dest + (local_128 & 0xffffffff),
         local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start,
         (long)local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
  memcpy(__dest + uVar6,
         local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start,
         (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
  memcpy(__dest + uVar8,
         local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start,
         (long)local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
  position = 0;
  sprintf(buffer,"%d",(ulong)GVar3);
  Utils::replaceToken("BASIC_SIZE",&position,buffer,&globals);
  sprintf(buffer,"%d",(ulong)uVar1);
  Utils::replaceToken("TYPE_ALIGN",&position,buffer,&globals);
  sprintf(buffer,"%d",(ulong)expected_stride_of_element);
  Utils::replaceToken("TYPE_SIZE",&position,buffer,&globals);
  this_01 = Utils::ProgramInterface::AddInterface(program_interface,"vs_buf_Block",BLOCK);
  Utils::Interface::Member
            (this_01,"at_first_offset","layout(offset = 0, align = 8 * basic_size)",0,0,&local_140,
             '\0',0,expected_stride_of_element,0);
  Utils::Interface::Member
            (this_01,"at_second_offset","layout(offset = type_size, align = basic_size / 2)",0,0,
             &local_140,'\0',0,expected_stride_of_element,(GLuint)local_108);
  Utils::Interface::Member
            (this_01,"at_third_offset","layout(align = 2 * type_align)",0,0,&local_140,'\0',0,
             expected_stride_of_element,(GLuint)local_130);
  Utils::Interface::Member
            (this_01,"at_fourth_offset","layout(offset = 3 * type_align + type_size)",0,0,&local_140
             ,'\0',0,expected_stride_of_element,(GLuint)local_118);
  Utils::Interface::Member
            (this_01,"at_fifth_offset",glcts::fixed_sample_locations_values + 1,0,0,&local_140,'\0',
             0,expected_stride_of_element,(GLuint)local_120);
  Utils::Interface::Member
            (this_01,"at_sixth_offset",glcts::fixed_sample_locations_values + 1,0,0,&local_140,'\0',
             2,GVar5 * 2,(GLuint)local_128);
  Utils::Interface::Member
            (this_01,"at_eigth_offset","layout(align = 8 * basic_size)",0,0,&local_140,'\0',0,
             expected_stride_of_element,uVar8);
  std::__cxx11::string::_M_assign((string *)&program_interface->m_vertex);
  data = (local_110->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start;
  data_size = (long)(local_110->m_data).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)data;
  Utils::ShaderInterface::SSB<unsigned_char>
            (&program_interface->m_vertex,"vs_buf_block","layout (std140, binding = BINDING)",0,0,
             this_01,0,(GLint)data_size,0,data,data_size);
  Utils::ProgramInterface::CloneVertexInterface(program_interface,varying_passthrough);
  if (local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)globals._M_dataplus._M_p != &globals.field_2) {
    operator_delete(globals._M_dataplus._M_p,globals.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SSBMemberOffsetAndAlignTest::getProgramInterface(GLuint					 test_case_index,
													  Utils::ProgramInterface&   program_interface,
													  Utils::VaryingPassthrough& varying_passthrough)
{
	std::string globals = "const int basic_size = BASIC_SIZE;\n"
						  "const int type_align = TYPE_ALIGN;\n"
						  "const int type_size  = TYPE_SIZE;\n";

	Utils::Type  type		 = getType(test_case_index);
	GLuint		 basic_size  = Utils::Type::GetTypeSize(type.m_basic_type);
	const GLuint base_align  = type.GetBaseAlignment(false);
	const GLuint array_align = type.GetBaseAlignment(true);
	const GLuint base_stride = Utils::Type::CalculateStd140Stride(base_align, type.m_n_columns, 0);
	const GLuint type_align  = Utils::roundUpToPowerOf2(base_stride);

	/* Calculate offsets */
	const GLuint first_offset  = 0;
	const GLuint second_offset = type.GetActualOffset(base_stride, basic_size / 2);

#if WRKARD_UNIFORMBLOCKMEMBEROFFSETANDALIGNTEST

	const GLuint third_offset   = type.GetActualOffset(second_offset + base_stride, base_align);
	const GLuint fourth_offset  = type.GetActualOffset(third_offset + base_stride, base_align);
	const GLuint fifth_offset   = type.GetActualOffset(fourth_offset + base_stride, base_align);
	const GLuint sixth_offset   = type.GetActualOffset(fifth_offset + base_stride, array_align);
	const GLuint seventh_offset = type.GetActualOffset(sixth_offset + base_stride, array_align);
	const GLuint eigth_offset   = type.GetActualOffset(seventh_offset + base_stride, array_align);

#else /* WRKARD_UNIFORMBLOCKMEMBEROFFSETANDALIGNTEST */

	const GLuint third_offset   = type.GetActualOffset(second_offset + base_stride, 2 * type_align);
	const GLuint fourth_offset  = type.GetActualOffset(3 * type_align + base_stride, base_align);
	const GLuint fifth_offset   = type.GetActualOffset(fourth_offset + base_stride, base_align);
	const GLuint sixth_offset   = type.GetActualOffset(fifth_offset + base_stride, array_align);
	const GLuint seventh_offset = type.GetActualOffset(sixth_offset + base_stride, array_align);
	const GLuint eigth_offset   = type.GetActualOffset(seventh_offset + base_stride, 8 * basic_size);

#endif /* WRKARD_UNIFORMBLOCKMEMBEROFFSETANDALIGNTEST */

	/* Prepare data */
	const std::vector<GLubyte>& first  = type.GenerateData();
	const std::vector<GLubyte>& second = type.GenerateData();
	const std::vector<GLubyte>& third  = type.GenerateData();
	const std::vector<GLubyte>& fourth = type.GenerateData();

	m_data.resize(eigth_offset + base_stride);
	GLubyte* ptr = &m_data[0];
	memcpy(ptr + first_offset, &first[0], first.size());
	memcpy(ptr + second_offset, &second[0], second.size());
	memcpy(ptr + third_offset, &third[0], third.size());
	memcpy(ptr + fourth_offset, &fourth[0], fourth.size());
	memcpy(ptr + fifth_offset, &fourth[0], fourth.size());
	memcpy(ptr + sixth_offset, &third[0], third.size());
	memcpy(ptr + seventh_offset, &second[0], second.size());
	memcpy(ptr + eigth_offset, &first[0], first.size());

	/* Prepare globals */
	size_t position = 0;
	GLchar buffer[16];

	sprintf(buffer, "%d", basic_size);
	Utils::replaceToken("BASIC_SIZE", position, buffer, globals);

	sprintf(buffer, "%d", type_align);
	Utils::replaceToken("TYPE_ALIGN", position, buffer, globals);

	sprintf(buffer, "%d", base_stride);
	Utils::replaceToken("TYPE_SIZE", position, buffer, globals);

	/* Prepare Block */
	Utils::Interface* vs_buf_block = program_interface.Block("vs_buf_Block");

	vs_buf_block->Member("at_first_offset", "layout(offset = 0, align = 8 * basic_size)", 0 /* expected_component */,
						 0 /* expected_location */, type, false /* normalized */, 0 /* n_array_elements */, base_stride,
						 first_offset);

	vs_buf_block->Member("at_second_offset", "layout(offset = type_size, align = basic_size / 2)",
						 0 /* expected_component */, 0 /* expected_location */, type, false /* normalized */,
						 0 /* n_array_elements */, base_stride, second_offset);

	vs_buf_block->Member("at_third_offset", "layout(align = 2 * type_align)", 0 /* expected_component */,
						 0 /* expected_location */, type, false /* normalized */, 0 /* n_array_elements */, base_stride,
						 third_offset);

	vs_buf_block->Member("at_fourth_offset", "layout(offset = 3 * type_align + type_size)", 0 /* expected_component */,
						 0 /* expected_location */, type, false /* normalized */, 0 /* n_array_elements */, base_stride,
						 fourth_offset);

	vs_buf_block->Member("at_fifth_offset", "", 0 /* expected_component */, 0 /* expected_location */, type,
						 false /* normalized */, 0 /* n_array_elements */, base_stride, fifth_offset);

	vs_buf_block->Member("at_sixth_offset", "", 0 /* expected_component */, 0 /* expected_location */, type,
						 false /* normalized */, 2 /* n_array_elements */, array_align * 2, sixth_offset);

	vs_buf_block->Member("at_eigth_offset", "layout(align = 8 * basic_size)", 0 /* expected_component */,
						 0 /* expected_location */, type, false /* normalized */, 0 /* n_array_elements */, base_stride,
						 eigth_offset);

	Utils::ShaderInterface& vs_si = program_interface.GetShaderInterface(Utils::Shader::VERTEX);

	/* Add globals */
	vs_si.m_globals = globals;

	/* Add uniform BLOCK */
	vs_si.SSB("vs_buf_block", "layout (std140, binding = BINDING)", 0, 0, vs_buf_block, 0,
			  static_cast<GLuint>(m_data.size()), 0, &m_data[0], m_data.size());

	/* */
	program_interface.CloneVertexInterface(varying_passthrough);
}